

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalNinjaGenerator::WriteTargetCleanAdditional(cmGlobalNinjaGenerator *this,ostream *os)

{
  cmLocalGenerator *pcVar1;
  int iVar2;
  reference pvVar3;
  string *psVar4;
  iterator iVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  mapped_type *pmVar8;
  bool bVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  pointer __k;
  pointer pbVar10;
  undefined8 in_R8;
  _Rb_tree_header *p_Var11;
  string_view str;
  string_view source;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  undefined1 local_410 [48];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
  *local_3e0;
  _Base_ptr local_3d8;
  key_type *local_3d0;
  cmAlphaNum local_3c8;
  string local_398;
  string cleanScriptAbs;
  string local_358;
  string local_338;
  string cleanScriptRel;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  cmGeneratedFileStream fout;
  
  pvVar3 = std::
           vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ::at(&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cleanScriptRel,"CMakeFiles/clean_additional.cmake",(allocator<char> *)&fout)
  ;
  psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                     ((pvVar3->_M_t).
                      super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                      .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
  fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (psVar4->_M_dataplus)._M_p;
  fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)psVar4->_M_string_length;
  local_410._8_8_ = local_410 + 0x10;
  local_410._0_8_ = (pointer)0x1;
  local_410[0x10] = '/';
  cmStrCat<std::__cxx11::string>
            (&cleanScriptAbs,(cmAlphaNum *)&fout,(cmAlphaNum *)local_410,&cleanScriptRel);
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            (&configs,(cmMakefile *)
                      (((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
                        super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                      super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t,
             IncludeEmptyConfig);
  pbVar10 = configs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  p_Var11 = &(this->Configs)._M_t._M_impl.super__Rb_tree_header;
  __k = configs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__k == pbVar10) {
      cmsys::SystemTools::RemoveFile(&cleanScriptAbs);
LAB_002e6b2d:
      bVar9 = false;
LAB_002e6b2f:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&configs);
      std::__cxx11::string::~string((string *)&cleanScriptAbs);
      std::__cxx11::string::~string((string *)&cleanScriptRel);
      return bVar9;
    }
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
            ::find(&(this->Configs)._M_t,__k);
    if (((_Rb_tree_header *)iVar5._M_node != p_Var11) &&
       (iVar5._M_node[3]._M_parent != (_Base_ptr)0x0)) {
      cmGeneratedFileStream::cmGeneratedFileStream(&fout,&cleanScriptAbs,false,None);
      if (((&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
           [(long)fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                  _vptr_basic_ostream[-3]] & 5) == 0) {
        local_3d8 = &p_Var11->_M_header;
        std::operator<<((ostream *)&fout,
                        "# Additional clean files\ncmake_minimum_required(VERSION 3.16)\n");
        local_3d0 = configs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        local_3e0 = &this->Configs;
        for (pbVar10 = configs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar10 != local_3d0;
            pbVar10 = pbVar10 + 1) {
          iVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
                  ::find(&local_3e0->_M_t,pbVar10);
          if ((iVar5._M_node != local_3d8) && (iVar5._M_node[3]._M_parent != (_Base_ptr)0x0)) {
            poVar6 = std::operator<<((ostream *)&fout,
                                     "\nif(\"${CONFIG}\" STREQUAL \"\" OR \"${CONFIG}\" STREQUAL \""
                                    );
            poVar6 = std::operator<<(poVar6,(string *)pbVar10);
            std::operator<<(poVar6,"\")\n");
            std::operator<<((ostream *)&fout,"  file(REMOVE_RECURSE\n");
            for (p_Var7 = iVar5._M_node[2]._M_right;
                p_Var7 != (_Base_ptr)&iVar5._M_node[2]._M_parent;
                p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
              poVar6 = std::operator<<((ostream *)&fout,"  ");
              psVar4 = ConvertToNinjaPath(this,(string *)(p_Var7 + 1));
              str._M_str = (char *)0x0;
              str._M_len = (size_t)(psVar4->_M_dataplus)._M_p;
              cmOutputConverter::EscapeForCMake_abi_cxx11_
                        ((string *)local_410,(cmOutputConverter *)psVar4->_M_string_length,str,
                         (WrapQuotes)in_R8);
              poVar6 = std::operator<<(poVar6,(string *)local_410);
              std::operator<<(poVar6,'\n');
              std::__cxx11::string::~string((string *)local_410);
            }
            std::operator<<((ostream *)&fout,"  )\n");
            std::operator<<((ostream *)&fout,"endif()\n");
          }
        }
        cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&((pvVar3->_M_t).
                      super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                      .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile->
                     OutputFiles,&cleanScriptAbs);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2b8,"CLEAN_ADDITIONAL",(allocator<char> *)local_410);
        cmNinjaRule::cmNinjaRule((cmNinjaRule *)&fout,&local_2b8);
        std::__cxx11::string::~string((string *)&local_2b8);
        CMakeCmd_abi_cxx11_(&local_398,this);
        local_410._0_8_ = local_398._M_string_length;
        local_410._8_8_ = local_398._M_dataplus._M_p;
        local_3c8.View_._M_len = 0x15;
        local_3c8.View_._M_str = " -DCONFIG=$CONFIG -P ";
        pcVar1 = (pvVar3->_M_t).
                 super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
                 super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
        NinjaOutputPath(&local_358,this,&cleanScriptRel);
        source._M_str = local_358._M_dataplus._M_p;
        source._M_len = local_358._M_string_length;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  (&local_2f8,&pcVar1->super_cmOutputConverter,source,SHELL);
        cmStrCat<std::__cxx11::string>(&local_338,(cmAlphaNum *)local_410,&local_3c8,&local_2f8);
        std::__cxx11::string::operator=
                  ((string *)
                   &fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    field_0x20,(string *)&local_338);
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::assign
                  (&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    field_0x40);
        std::__cxx11::string::assign
                  (&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    field_0x60);
        WriteRule((ostream *)
                  (this->RulesFileStream)._M_t.
                  super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                  .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                  (cmNinjaRule *)&fout);
        cmNinjaRule::~cmNinjaRule((cmNinjaRule *)&fout);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2d8,"CLEAN_ADDITIONAL",(allocator<char> *)local_410);
        cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)&fout,&local_2d8);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::assign((char *)&fout);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                             field_0x40);
        for (pbVar10 = configs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pbVar10 !=
            configs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; pbVar10 = pbVar10 + 1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_338,"CMakeFiles/clean.additional",
                     (allocator<char> *)&local_398);
          NinjaOutputPath((string *)&local_3c8,this,&local_338);
          (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x48])((key_type *)local_410,this,&local_3c8);
          std::__cxx11::string::operator=
                    ((string *)
                     fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._64_8_,
                     (string *)local_410);
          std::__cxx11::string::~string((string *)local_410);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::__cxx11::string::~string((string *)&local_338);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_410,"CONFIG",(allocator<char> *)&local_3c8);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&fout.super_ofstream.
                                    super_basic_ostream<char,_std::char_traits<char>_>.field_0xd0,
                                (key_type *)local_410);
          std::__cxx11::string::_M_assign((string *)pmVar8);
          std::__cxx11::string::~string((string *)local_410);
          WriteBuild(this,os,(cmNinjaBuild *)&fout,0,(bool *)0x0);
        }
        iVar2 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                  _vptr_cmGlobalGenerator[0x26])();
        if ((char)iVar2 != '\0') {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3c8,"CMakeFiles/clean.additional",
                     (allocator<char> *)&local_338);
          NinjaOutputPath((string *)local_410,this,(string *)&local_3c8);
          std::__cxx11::string::operator=
                    ((string *)
                     fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._64_8_,
                     (string *)local_410);
          std::__cxx11::string::~string((string *)local_410);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_410,"CONFIG",(allocator<char> *)&local_3c8);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&fout.super_ofstream.
                                    super_basic_ostream<char,_std::char_traits<char>_>.field_0xd0,
                                (key_type *)local_410);
          std::__cxx11::string::assign((char *)pmVar8);
          std::__cxx11::string::~string((string *)local_410);
          WriteBuild(this,os,(cmNinjaBuild *)&fout,0,(bool *)0x0);
        }
        cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&fout);
        bVar9 = true;
        goto LAB_002e6b2f;
      }
      cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
      goto LAB_002e6b2d;
    }
    __k = __k + 1;
  } while( true );
}

Assistant:

bool cmGlobalNinjaGenerator::WriteTargetCleanAdditional(std::ostream& os)
{
  const auto& lgr = this->LocalGenerators.at(0);
  std::string cleanScriptRel = "CMakeFiles/clean_additional.cmake";
  std::string cleanScriptAbs =
    cmStrCat(lgr->GetBinaryDirectory(), '/', cleanScriptRel);
  std::vector<std::string> configs =
    this->Makefiles[0]->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  // Check if there are additional files to clean
  bool empty = true;
  for (auto const& config : configs) {
    auto const it = this->Configs.find(config);
    if (it != this->Configs.end() &&
        !it->second.AdditionalCleanFiles.empty()) {
      empty = false;
      break;
    }
  }
  if (empty) {
    // Remove cmake clean script file if it exists
    cmSystemTools::RemoveFile(cleanScriptAbs);
    return false;
  }

  // Write cmake clean script file
  {
    cmGeneratedFileStream fout(cleanScriptAbs);
    if (!fout) {
      return false;
    }
    fout << "# Additional clean files\ncmake_minimum_required(VERSION 3.16)\n";
    for (auto const& config : configs) {
      auto const it = this->Configs.find(config);
      if (it != this->Configs.end() &&
          !it->second.AdditionalCleanFiles.empty()) {
        fout << "\nif(\"${CONFIG}\" STREQUAL \"\" OR \"${CONFIG}\" STREQUAL \""
             << config << "\")\n";
        fout << "  file(REMOVE_RECURSE\n";
        for (std::string const& acf : it->second.AdditionalCleanFiles) {
          fout << "  "
               << cmOutputConverter::EscapeForCMake(
                    this->ConvertToNinjaPath(acf))
               << '\n';
        }
        fout << "  )\n";
        fout << "endif()\n";
      }
    }
  }
  // Register clean script file
  lgr->GetMakefile()->AddCMakeOutputFile(cleanScriptAbs);

  // Write rule
  {
    cmNinjaRule rule("CLEAN_ADDITIONAL");
    rule.Command = cmStrCat(
      this->CMakeCmd(), " -DCONFIG=$CONFIG -P ",
      lgr->ConvertToOutputFormat(this->NinjaOutputPath(cleanScriptRel),
                                 cmOutputConverter::SHELL));
    rule.Description = "Cleaning additional files...";
    rule.Comment = "Rule for cleaning additional files.";
    WriteRule(*this->RulesFileStream, rule);
  }

  // Write build
  {
    cmNinjaBuild build("CLEAN_ADDITIONAL");
    build.Comment = "Clean additional files.";
    build.Outputs.emplace_back();
    for (auto const& config : configs) {
      build.Outputs.front() = this->BuildAlias(
        this->NinjaOutputPath(this->GetAdditionalCleanTargetName()), config);
      build.Variables["CONFIG"] = config;
      this->WriteBuild(os, build);
    }
    if (this->IsMultiConfig()) {
      build.Outputs.front() =
        this->NinjaOutputPath(this->GetAdditionalCleanTargetName());
      build.Variables["CONFIG"] = "";
      this->WriteBuild(os, build);
    }
  }
  // Return success
  return true;
}